

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObservationModelMappingSparse.h
# Opt level: O2

void __thiscall
ObservationModelMappingSparse::Set
          (ObservationModelMappingSparse *this,Index ja_i,Index suc_s_i,Index jo_i,double prob)

{
  ulong i;
  ulong j;
  double local_50;
  sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  local_48;
  
  i = (ulong)suc_s_i;
  j = (ulong)jo_i;
  local_50 = prob;
  local_48.i_ = i;
  local_48.j_ = j;
  if (prob <= 1e-12) {
    local_48.
    super_container_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
    .c_ = (this->_m_O).
          super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start[ja_i];
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
    ::get_d(&local_48);
    if (1e-12 < local_48.d_) {
      boost::numeric::ublas::
      compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::erase_element((this->_m_O).
                      super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[ja_i],i,j);
    }
  }
  else {
    local_48.
    super_container_reference<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
    .c_ = (this->_m_O).
          super__Vector_base<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start[ja_i];
    boost::numeric::ublas::
    sparse_matrix_element<boost::numeric::ublas::compressed_matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
    ::set(&local_48,&local_50);
  }
  return;
}

Assistant:

void Set(Index ja_i, Index suc_s_i, Index jo_i, double prob)
        {
            // make sure probability is not 0
            if(prob > PROB_PRECISION)
                (*_m_O[ja_i])(suc_s_i,jo_i)=prob;
            // check if we already defined this element, if so remove it
            else if((*_m_O[ja_i])(suc_s_i,jo_i)>PROB_PRECISION)
                (*_m_O[ja_i]).erase_element(suc_s_i,jo_i);
        }